

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_fill_circle(nk_command_buffer *b,nk_rect r,nk_color c)

{
  void *pvVar1;
  float local_40;
  float local_3c;
  nk_rect *clip;
  nk_command_circle_filled *cmd;
  nk_command_buffer *b_local;
  float fStack_18;
  nk_color c_local;
  nk_rect r_local;
  
  if (b != (nk_command_buffer *)0x0) {
    if ((b != (nk_command_buffer *)0x0) && (b_local._7_1_ = c.a, b_local._7_1_ != '\0')) {
      r_local.x = r.w;
      if ((r_local.x != 0.0) || (NAN(r_local.x))) {
        r_local.y = r.h;
        if ((r_local.y != 0.0) || (NAN(r_local.y))) {
          fStack_18 = r.x;
          c_local = (nk_color)r.y;
          if (((b->use_clipping == 0) ||
              (((((b->clip).x <= fStack_18 + r_local.x && (fStack_18 <= (b->clip).x + (b->clip).w))
                && ((b->clip).y <= (float)c_local + r_local.y)) &&
               ((float)c_local <= (b->clip).y + (b->clip).h)))) &&
             (pvVar1 = nk_command_buffer_push(b,NK_COMMAND_CIRCLE_FILLED,0x20),
             pvVar1 != (void *)0x0)) {
            *(short *)((long)pvVar1 + 0x10) = (short)(int)fStack_18;
            *(short *)((long)pvVar1 + 0x12) = (short)(int)(float)c_local;
            if (0.0 <= r_local.x) {
              local_3c = r_local.x;
            }
            else {
              local_3c = 0.0;
            }
            *(short *)((long)pvVar1 + 0x14) = (short)(int)local_3c;
            if (0.0 <= r_local.y) {
              local_40 = r_local.y;
            }
            else {
              local_40 = 0.0;
            }
            *(short *)((long)pvVar1 + 0x16) = (short)(int)local_40;
            *(nk_color *)((long)pvVar1 + 0x18) = c;
          }
        }
      }
    }
    return;
  }
  __assert_fail("b",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x1d42,
                "void nk_fill_circle(struct nk_command_buffer *, struct nk_rect, struct nk_color)");
}

Assistant:

NK_API void
nk_fill_circle(struct nk_command_buffer *b, struct nk_rect r, struct nk_color c)
{
    struct nk_command_circle_filled *cmd;
    NK_ASSERT(b);
    if (!b || c.a == 0 || r.w == 0 || r.h == 0) return;
    if (b->use_clipping) {
        const struct nk_rect *clip = &b->clip;
        if (!NK_INTERSECT(r.x, r.y, r.w, r.h, clip->x, clip->y, clip->w, clip->h))
            return;
    }

    cmd = (struct nk_command_circle_filled*)
        nk_command_buffer_push(b, NK_COMMAND_CIRCLE_FILLED, sizeof(*cmd));
    if (!cmd) return;
    cmd->x = (short)r.x;
    cmd->y = (short)r.y;
    cmd->w = (unsigned short)NK_MAX(r.w, 0);
    cmd->h = (unsigned short)NK_MAX(r.h, 0);
    cmd->color = c;
}